

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O1

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::Int(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
      *this,int i)

{
  Stack<rapidjson::CrtAllocator> *this_00;
  char *pcVar1;
  char *pcVar2;
  uint32_t u;
  
  Prefix(this,kNumberType);
  this_00 = &this->os_->stack_;
  if ((long)this_00->stackEnd_ - (long)this_00->stackTop_ < 0xb) {
    internal::Stack<rapidjson::CrtAllocator>::Expand<char>(this_00,0xb);
  }
  pcVar1 = this_00->stackTop_;
  this_00->stackTop_ = pcVar1 + 0xb;
  pcVar2 = pcVar1;
  if (i < 0) {
    *pcVar1 = '-';
    i = -i;
    pcVar2 = pcVar1 + 1;
  }
  pcVar2 = internal::u32toa(i,pcVar2);
  (this->os_->stack_).stackTop_ =
       pcVar2 + (long)((this->os_->stack_).stackTop_ + (-0xb - (long)pcVar1));
  return true;
}

Assistant:

bool Int(int i)             { Prefix(kNumberType); return EndValue(WriteInt(i)); }